

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudioVoice_GetFilterParameters(FAudioVoice *voice,FAudioFilterParameters *pParameters)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if ((*(int *)(in_RDI + 0xc) != 2) && ((*(uint *)(in_RDI + 8) & 8) != 0)) {
    FAudio_PlatformLockMutex((FAudioMutex)0x127e2e);
    SDL_memcpy(in_RSI,in_RDI + 0x78,0xc);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x127e57);
  }
  return;
}

Assistant:

void FAudioVoice_GetFilterParameters(
	FAudioVoice *voice,
	FAudioFilterParameters *pParameters
) {
	LOG_API_ENTER(voice->audio)

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return;
	}

	if (!(voice->flags & FAUDIO_VOICE_USEFILTER))
	{
		LOG_API_EXIT(voice->audio)
		return;
	}

	FAudio_PlatformLockMutex(voice->filterLock);
	LOG_MUTEX_LOCK(voice->audio, voice->filterLock)
	FAudio_memcpy(
		pParameters,
		&voice->filter,
		sizeof(FAudioFilterParameters)
	);
	FAudio_PlatformUnlockMutex(voice->filterLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->filterLock)
	LOG_API_EXIT(voice->audio)
}